

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void heightOfExprList(ExprList *p,int *pnHeight)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int i;
  long lVar4;
  
  if (p != (ExprList *)0x0) {
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < p->nExpr; lVar4 = lVar4 + 1) {
      lVar2 = *(long *)((long)&p->a->pExpr + lVar3);
      if ((lVar2 != 0) && (iVar1 = *(int *)(lVar2 + 0x28), *pnHeight < iVar1)) {
        *pnHeight = iVar1;
      }
      lVar3 = lVar3 + 0x20;
    }
  }
  return;
}

Assistant:

static void heightOfExprList(ExprList *p, int *pnHeight){
  if( p ){
    int i;
    for(i=0; i<p->nExpr; i++){
      heightOfExpr(p->a[i].pExpr, pnHeight);
    }
  }
}